

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatParser_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::SamFormatParser::ParsePGLine(SamFormatParser *this,string *line)

{
  __type _Var1;
  bool bVar2;
  BamException *this_00;
  string *this_01;
  SamProgram *pSVar3;
  pointer pbVar4;
  allocator local_1a9;
  SamFormatParser *local_1a8;
  CustomHeaderTag otherTag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string tokenTag;
  string tokenValue;
  SamProgram pg;
  
  this_01 = line;
  local_1a8 = this;
  SamProgram::SamProgram(&pg);
  Split(&tokens,(SamFormatParser *)this_01,line,'\t');
  pbVar4 = tokens.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar4 == tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = SamProgram::HasID(&pg);
      if (bVar2) {
        SamProgramChain::Add(&local_1a8->m_header->Programs,&pg);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tokens);
        SamProgram::~SamProgram(&pg);
        return;
      }
      this_00 = (BamException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&otherTag,"SamFormatParser::ParsePGLine",(allocator *)&tokenValue);
      std::__cxx11::string::string((string *)&tokenTag,"@PG line is missing ID tag",&local_1a9);
      BamException::BamException(this_00,&otherTag.TagName,&tokenTag);
      __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
    }
    std::__cxx11::string::substr((ulong)&tokenTag,(ulong)pbVar4);
    std::__cxx11::string::substr((ulong)&tokenValue,(ulong)pbVar4);
    _Var1 = std::operator==(&tokenTag,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            Constants::SAM_PG_ID_TAG_abi_cxx11_);
    pSVar3 = (SamProgram *)&pg.ID;
    if (_Var1) {
LAB_0015799d:
      std::__cxx11::string::_M_assign((string *)pSVar3);
    }
    else {
      _Var1 = std::operator==(&tokenTag,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              Constants::SAM_PG_NAME_TAG_abi_cxx11_);
      pSVar3 = (SamProgram *)&pg.Name;
      if (_Var1) goto LAB_0015799d;
      _Var1 = std::operator==(&tokenTag,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              Constants::SAM_PG_COMMANDLINE_TAG_abi_cxx11_);
      pSVar3 = &pg;
      if (_Var1) goto LAB_0015799d;
      _Var1 = std::operator==(&tokenTag,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              Constants::SAM_PG_PREVIOUSPROGRAM_TAG_abi_cxx11_);
      pSVar3 = (SamProgram *)&pg.PreviousProgramID;
      if (_Var1) goto LAB_0015799d;
      _Var1 = std::operator==(&tokenTag,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              Constants::SAM_PG_VERSION_TAG_abi_cxx11_);
      pSVar3 = (SamProgram *)&pg.Version;
      if (_Var1) goto LAB_0015799d;
      otherTag.TagName._M_dataplus._M_p = (pointer)&otherTag.TagName.field_2;
      otherTag.TagName._M_string_length = 0;
      otherTag.TagName.field_2._M_local_buf[0] = '\0';
      otherTag.TagValue._M_dataplus._M_p = (pointer)&otherTag.TagValue.field_2;
      otherTag.TagValue._M_string_length = 0;
      otherTag.TagValue.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&otherTag);
      std::__cxx11::string::_M_assign((string *)&otherTag.TagValue);
      std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::push_back
                (&pg.CustomTags,&otherTag);
      CustomHeaderTag::~CustomHeaderTag(&otherTag);
    }
    std::__cxx11::string::~string((string *)&tokenValue);
    std::__cxx11::string::~string((string *)&tokenTag);
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

void SamFormatParser::ParsePGLine(const string& line) {

    SamProgram pg;

    // split string into tokens
    vector<string> tokens = Split(line, Constants::SAM_TAB);

    // iterate over tokens
    vector<string>::const_iterator tokenIter = tokens.begin();
    vector<string>::const_iterator tokenEnd  = tokens.end();
    for ( ; tokenIter != tokenEnd; ++tokenIter ) {

        // get token tag/value
        const string tokenTag = (*tokenIter).substr(0,2);
        const string tokenValue = (*tokenIter).substr(3);

        // set program record contents
        if      ( tokenTag == Constants::SAM_PG_ID_TAG              ) pg.ID = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_NAME_TAG            ) pg.Name = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_COMMANDLINE_TAG     ) pg.CommandLine = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_PREVIOUSPROGRAM_TAG ) pg.PreviousProgramID = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_VERSION_TAG         ) pg.Version = tokenValue;
        else { // custom tag
            CustomHeaderTag otherTag;
            otherTag.TagName  = tokenTag;
            otherTag.TagValue = tokenValue;
            pg.CustomTags.push_back(otherTag);
        }
    }

    // check for required tags
    if ( !pg.HasID() )
        throw BamException("SamFormatParser::ParsePGLine", "@PG line is missing ID tag");

    // store SAM program entry
    m_header.Programs.Add(pg);
}